

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_verifier.cpp
# Opt level: O2

unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
__thiscall
duckdb::StatementVerifier::Create
          (StatementVerifier *this,VerificationType type,SQLStatement *statement_p,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  InternalException *this_00;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 1:
    CopiedStatementVerifier::Create((CopiedStatementVerifier *)this,statement_p,parameters);
    break;
  case 2:
    DeserializedStatementVerifier::Create
              ((DeserializedStatementVerifier *)this,statement_p,parameters);
    break;
  case 3:
    ParsedStatementVerifier::Create((ParsedStatementVerifier *)this,statement_p,parameters);
    break;
  case 4:
    UnoptimizedStatementVerifier::Create
              ((UnoptimizedStatementVerifier *)this,statement_p,parameters);
    break;
  case 5:
    NoOperatorCachingVerifier::Create((NoOperatorCachingVerifier *)this,statement_p,parameters);
    break;
  case 6:
    PreparedStatementVerifier::Create((PreparedStatementVerifier *)this,statement_p,parameters);
    break;
  case 7:
    ExternalStatementVerifier::Create((ExternalStatementVerifier *)this,statement_p,parameters);
    break;
  case 8:
    FetchRowVerifier::Create((FetchRowVerifier *)this,statement_p,parameters);
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Invalid statement verification type!",&local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         this;
}

Assistant:

unique_ptr<StatementVerifier>
StatementVerifier::Create(VerificationType type, const SQLStatement &statement_p,
                          optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {
	switch (type) {
	case VerificationType::COPIED:
		return CopiedStatementVerifier::Create(statement_p, parameters);
	case VerificationType::DESERIALIZED:
		return DeserializedStatementVerifier::Create(statement_p, parameters);
	case VerificationType::PARSED:
		return ParsedStatementVerifier::Create(statement_p, parameters);
	case VerificationType::UNOPTIMIZED:
		return UnoptimizedStatementVerifier::Create(statement_p, parameters);
	case VerificationType::NO_OPERATOR_CACHING:
		return NoOperatorCachingVerifier::Create(statement_p, parameters);
	case VerificationType::PREPARED:
		return PreparedStatementVerifier::Create(statement_p, parameters);
	case VerificationType::EXTERNAL:
		return ExternalStatementVerifier::Create(statement_p, parameters);
	case VerificationType::FETCH_ROW_AS_SCAN:
		return FetchRowVerifier::Create(statement_p, parameters);
	case VerificationType::INVALID:
	default:
		throw InternalException("Invalid statement verification type!");
	}
}